

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

int __thiscall QDate::dayOfYear(QDate *this)

{
  qint64 qVar1;
  int iVar2;
  longlong *plVar3;
  long in_FS_OFFSET;
  optional<long_long> oVar4;
  _Storage<long_long,_true> local_28;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = year(this);
    oVar4 = QGregorianCalendar::julianFromParts(iVar2,1,1);
    local_28._M_value =
         oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>._M_payload;
    local_20 = (undefined1 *)
               CONCAT71(local_20._1_7_,
                        oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
                        super__Optional_payload_base<long_long>._M_engaged);
    iVar2 = 0;
    if (((undefined1  [16])
         oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      qVar1 = this->jd;
      plVar3 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
               _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *
                      )&local_28);
      iVar2 = ((int)qVar1 - (int)*plVar3) + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QDate::dayOfYear() const
{
    if (isValid()) {
        if (const auto first = QGregorianCalendar::julianFromParts(year(), 1, 1))
            return jd - *first + 1;
    }
    return 0;
}